

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O2

int __thiscall dlib::directory::init(directory *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  size_type sVar2;
  int iVar3;
  char *pcVar4;
  dir_not_found *pdVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10e8;
  stat64 buffer;
  char buf [4096];
  
  pcVar4 = realpath(*(char **)ctx,buf);
  if (pcVar4 == (char *)0x0) {
    pdVar5 = (dir_not_found *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                   "Unable to find directory ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
    dir_not_found::dir_not_found(pdVar5,(string *)&buffer);
    __cxa_throw(pdVar5,&dir_not_found::typeinfo,error::~error);
  }
  psVar1 = &(this->state).full_name;
  std::__cxx11::string::assign((char *)psVar1);
  pcVar4 = (this->state).full_name._M_dataplus._M_p;
  sVar2 = (this->state).full_name._M_string_length;
  if ((sVar2 != 1) || (*pcVar4 != '/')) {
    if (pcVar4[sVar2 - 1] == '/') {
      std::__cxx11::string::erase((ulong)psVar1,sVar2 - 1);
    }
    std::__cxx11::string::rfind((char)psVar1,0x2f);
    std::__cxx11::string::substr((ulong)&buffer,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)this,(string *)&buffer);
    std::__cxx11::string::~string((string *)&buffer);
    pcVar4 = (this->state).full_name._M_dataplus._M_p;
  }
  iVar3 = stat64(pcVar4,(stat64 *)&buffer);
  if (iVar3 == 0) {
    if ((buffer.st_mode & 0xf000) == 0x4000) {
      return 0x4000;
    }
    pdVar5 = (dir_not_found *)__cxa_allocate_exception(0x30);
    std::operator+(&bStack_10e8,"Unable to find directory ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
    dir_not_found::dir_not_found(pdVar5,&bStack_10e8);
    __cxa_throw(pdVar5,&dir_not_found::typeinfo,error::~error);
  }
  pdVar5 = (dir_not_found *)__cxa_allocate_exception(0x30);
  std::operator+(&bStack_10e8,"Unable to find directory ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
  dir_not_found::dir_not_found(pdVar5,&bStack_10e8);
  __cxa_throw(pdVar5,&dir_not_found::typeinfo,error::~error);
}

Assistant:

void directory::
    init (
        const std::string& name
    )
    {
        using namespace std;

        
        char buf[PATH_MAX];
        if (realpath(name.c_str(),buf) == 0)
        {
            // the directory was not found
            throw dir_not_found("Unable to find directory " + name);
        }
        state.full_name = buf;
  
        
        const char sep = get_separator();
        if (is_root_path(state.full_name) == false)
        {
            // ensure that thre is not a trialing separator
            if (state.full_name[state.full_name.size()-1] == sep)
                state.full_name.erase(state.full_name.size()-1);

            // pick out the directory name
            string::size_type pos = state.full_name.find_last_of(sep);
            state.name = state.full_name.substr(pos+1);
        }
        else
        {
            // ensure that there is a trailing separator
            if (state.full_name[state.full_name.size()-1] != sep)
                state.full_name += sep;
        }


        struct stat64 buffer;
        // now check that this is actually a valid directory
        if (::stat64(state.full_name.c_str(),&buffer))
        {
            // the directory was not found
            throw dir_not_found("Unable to find directory " + name);
        }
        else if (S_ISDIR(buffer.st_mode) == 0)
        {
            // It is not a directory
            throw dir_not_found("Unable to find directory " + name);
        }
    }